

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicBWT.h
# Opt level: O2

ulint __thiscall
bwtil::
DynamicBWT<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>,_bwtil::dynamic_vector<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>
::extend(DynamicBWT<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>,_bwtil::dynamic_vector<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>
         *this,symbol s)

{
  pointer puVar1;
  unsigned_long uVar2;
  pointer puVar3;
  ulint uVar4;
  size_t sVar5;
  undefined7 in_register_00000031;
  ulong uVar6;
  bool bVar7;
  bool bVar8;
  
  DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>::insert
            (&this->ds,s,this->terminator_pos);
  uVar6 = CONCAT71(in_register_00000031,s) & 0xffffffff;
  uVar2 = (this->F).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[uVar6];
  uVar4 = DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>::rank
                    (&this->ds,s,this->terminator_pos);
  this->terminator_pos = uVar4 + uVar2;
  puVar3 = (this->F).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  while (uVar6 = uVar6 + 1, uVar6 < this->sigma) {
    puVar1 = puVar3 + uVar6;
    *puVar1 = *puVar1 + 1;
  }
  sVar5 = this->terminator_pos;
  if (this->sample_rate != 0) {
    uVar6 = this->current_size;
    bVar7 = uVar6 % this->sample_rate == 0;
    bVar8 = uVar6 == this->n - 1;
    bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>::insert
              (&this->sampled_positions,sVar5,bVar8 || bVar7);
    sVar5 = this->terminator_pos;
    if (bVar8 || bVar7) {
      sVar5 = bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>::rank
                        (&this->sampled_positions,sVar5,true);
      dynamic_vector<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>::insert
                (&this->sa_samples,sVar5,this->current_size);
      sVar5 = this->terminator_pos;
    }
  }
  this->current_size = this->current_size + 1;
  return sVar5;
}

Assistant:

ulint extend(symbol s){

		//insert in position terminator_pos character s
		ds.insert(s,terminator_pos);

		//update terminator position
		terminator_pos = F[s] + ds.rank(s,terminator_pos);

		//update F
		for(ulint i=s+1;i<sigma;i++)
			F[i]++;

		//update samples
		if(sample_rate>0){

			//check if this position has to be sampled
			//first text position is always sampled
			bool sampled = ((current_size%sample_rate)==0) or current_size==n-1;

			//always update bitvector
			sampled_positions.insert(terminator_pos,sampled);

			//update dynamic vector only if the position is sampled
			if(sampled)
				sa_samples.insert( sampled_positions.rank(terminator_pos,true), current_size );

		}

		current_size++;

		return terminator_pos;

	}